

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void __thiscall duckdb::FinalizeState::FinalizeState(FinalizeState *this,idx_t state_size_p)

{
  Allocator *allocator;
  LogicalType LStack_38;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__FinalizeState_027b1ed0;
  this->state_size = state_size_p;
  make_unsafe_uniq_array<unsigned_char>
            ((duckdb *)&this->state_buffer,state_size_p * 0x800 + 0x3800 & 0xffffffffffffc000);
  LogicalType::LogicalType(&LStack_38,POINTER);
  Vector::Vector(&this->addresses,&LStack_38,0x800);
  LogicalType::~LogicalType(&LStack_38);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x800);
  return;
}

Assistant:

explicit FinalizeState(idx_t state_size_p)
	    : state_size(state_size_p),
	      state_buffer(make_unsafe_uniq_array<data_t>(STANDARD_VECTOR_SIZE * AlignValue(state_size_p))),
	      addresses(LogicalType::POINTER), allocator(Allocator::DefaultAllocator()) {
	}